

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# am_value.cpp
# Opt level: O0

Am_Method_Wrapper * __thiscall Am_Value::operator_cast_to_Am_Method_Wrapper_(Am_Value *this)

{
  Am_ID_Tag AVar1;
  uint uVar2;
  Am_Value *this_local;
  
  AVar1 = Am_Type_Class(this->type);
  if (AVar1 == 0x3000) {
    this_local = (Am_Value *)(this->value).wrapper_value;
  }
  else {
    uVar2 = (uint)this->type;
    if (uVar2 == 1) {
      this_local = (Am_Value *)0x0;
    }
    else if (((uVar2 - 2 < 2) || (uVar2 - 9 < 2)) &&
            ((this->value).wrapper_value == (Am_Wrapper *)0x0)) {
      this_local = (Am_Value *)0x0;
    }
    else {
      type_error("Am_Method_Wrapper*",this);
      this_local = (Am_Value *)0x0;
    }
  }
  return (Am_Method_Wrapper *)this_local;
}

Assistant:

Am_Value::operator Am_Method_Wrapper *() const
{
  if (Am_Type_Class(type) == Am_METHOD)
    return value.method_value;
  switch (type) {
  case Am_ZERO:
    return nullptr;
  case Am_PROC:
  case Am_INT:
  case Am_LONG:
  case Am_VOIDPTR:
    if (!value.voidptr_value)
      return nullptr;
  default:
    type_error("Am_Method_Wrapper*", *this);
    return nullptr;
  }
}